

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void duckdb_je_base_stats_get
               (tsdn_t *tsdn,base_t *base,size_t *allocated,size_t *edata_allocated,
               size_t *rtree_allocated,size_t *resident,size_t *mapped,size_t *n_thp)

{
  malloc_mutex_lock(tsdn,&base->mtx);
  *allocated = base->allocated;
  *edata_allocated = base->edata_allocated;
  *rtree_allocated = base->rtree_allocated;
  *resident = base->resident;
  *mapped = base->mapped;
  *n_thp = base->n_thp;
  (base->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x48));
  return;
}

Assistant:

void
base_stats_get(tsdn_t *tsdn, base_t *base, size_t *allocated,
    size_t *edata_allocated, size_t *rtree_allocated, size_t *resident,
    size_t *mapped, size_t *n_thp) {
	cassert(config_stats);

	malloc_mutex_lock(tsdn, &base->mtx);
	assert(base->allocated <= base->resident);
	assert(base->resident <= base->mapped);
	assert(base->edata_allocated + base->rtree_allocated <= base->allocated);
	*allocated = base->allocated;
	*edata_allocated = base->edata_allocated;
	*rtree_allocated = base->rtree_allocated;
	*resident = base->resident;
	*mapped = base->mapped;
	*n_thp = base->n_thp;
	malloc_mutex_unlock(tsdn, &base->mtx);
}